

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::CopyingOutputStreamAdaptor
          (CopyingOutputStreamAdaptor *this,CopyingOutputStream *copying_stream,int block_size)

{
  int iVar1;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__CopyingOutputStreamAdaptor_0062c6b8;
  this->copying_stream_ = copying_stream;
  this->owns_copying_stream_ = false;
  this->failed_ = false;
  iVar1 = 0x2000;
  if (0 < block_size) {
    iVar1 = block_size;
  }
  this->position_ = 0;
  (this->buffer_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  this->buffer_size_ = iVar1;
  this->buffer_used_ = 0;
  return;
}

Assistant:

CopyingOutputStreamAdaptor::CopyingOutputStreamAdaptor(
    CopyingOutputStream* copying_stream, int block_size)
    : copying_stream_(copying_stream),
      owns_copying_stream_(false),
      failed_(false),
      position_(0),
      buffer_size_(block_size > 0 ? block_size : kDefaultBlockSize),
      buffer_used_(0) {}